

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OGreater
          (_Type_CLASS_OBJECT *this,Variable *object_1,Variable *object_2)

{
  State *state;
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Variable v;
  Variable VStack_68;
  undefined1 local_58 [16];
  pointer local_48;
  pointer *local_40;
  
  pOVar2 = Variable::operator->(object_2);
  Class::GetOperator((Class *)&stack0xffffffffffffffd0,
                     (OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
  pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd0);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(object_2);
    if (*(long *)((long)pOVar2->data + 0x40) != 0) {
      pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd0);
      state = (State *)pOVar2->data;
      local_40 = &local_48;
      local_48 = (pointer)((ulong)local_48 & 0xffffffffffffff00);
      Variable::Variable((Variable *)local_58,object_2);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)local_58);
      if (local_48._0_1_ == false) {
        Variable::~Variable((Variable *)local_58);
      }
      local_58._0_8_ = (Object *)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_48 = (pointer)0x0;
      Variable::Variable(&VStack_68,in_RCX);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_58,
                 &VStack_68);
      Variable::~Variable(&VStack_68);
      Variable::Variable(&VStack_68,object_2);
      pOVar2 = Variable::operator->(&VStack_68);
      Callback::operator()
                ((Callback *)this,state,
                 *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                  ((long)pOVar2->data + 0x40));
      Variable::~Variable(&VStack_68);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_58);
      goto LAB_001271a8;
    }
  }
  pOVar2 = Variable::operator->(object_2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
LAB_001271a8:
  Variable::~Variable((Variable *)&stack0xffffffffffffffd0);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OGreater(const Variable& object_1, const Variable& object_2) const {
    Variable v = object_1->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_GREAT);
    if (v->GetType() == Type::CALLBACK) {
        if (object_1->GetData<ClassObject>().ScriptState == nullptr)
            return object_1->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object_1);
        std::vector<Variable> args;
        args.push_back(Variable(object_2));
        return call(*(Variable(object_1)->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object_1->memory.Create(Type::NIL);
    }
}